

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.h
# Opt level: O3

bool __thiscall
lemon::
BellmanFord<lemon::SmartDigraph,_bidirectional::ResourceMap,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>_>
::processNextRound(BellmanFord<lemon::SmartDigraph,_bidirectional::ResourceMap,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_bidirectional::ResourceMap>_>
                   *this)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  pointer pdVar3;
  Digraph *pDVar4;
  ulong uVar5;
  pointer pNVar6;
  byte bVar7;
  pointer pNVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  size_type __n;
  pointer pNVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  iterator iVar16;
  pointer pNVar17;
  double dVar18;
  Node target;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> nextProcess;
  vector<double,_std::allocator<double>_> values;
  Node local_6c;
  pointer local_68;
  iterator iStack_60;
  pointer local_58;
  vector<double,_std::allocator<double>_> local_48;
  
  pNVar12 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(this->_process).
              super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar12 >> 2;
  uVar9 = (uint)__n;
  if (0 < (int)uVar9) {
    p_Var2 = (this->_mask->
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
             ).
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
             .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar13 = 0;
    do {
      iVar10 = pNVar12[uVar13]._id;
      iVar14 = iVar10 + 0x3f;
      if (-1 < (long)iVar10) {
        iVar14 = iVar10;
      }
      bVar7 = (byte)iVar10 & 0x3f;
      puVar1 = p_Var2 + (long)(iVar14 >> 6) +
                        (ulong)(((long)iVar10 & 0x800000000000003fU) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      uVar13 = uVar13 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar13);
  }
  local_68 = (pointer)0x0;
  iStack_60._M_current = (pointer)0x0;
  local_58 = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,(allocator_type *)&local_6c);
  pNVar12 = (this->_process).
            super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pNVar8 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (uint)((ulong)((long)pNVar8 - (long)pNVar12) >> 2);
  if (0 < (int)uVar9) {
    pdVar3 = (this->_dist->
             super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
             ).
             super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
             .super_Map.container.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = 0;
    do {
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar13] = pdVar3[pNVar12[uVar13]._id];
      uVar13 = uVar13 + 1;
    } while ((uVar9 & 0x7fffffff) != uVar13);
    if (0 < (int)uVar9) {
      lVar15 = 0;
      do {
        pDVar4 = this->_gr;
        iVar10 = *(int *)(*(long *)&(pDVar4->super_ExtendedSmartDigraphBase).super_SmartDigraphBase.
                                    _nodes.
                                    super__Vector_base<lemon::SmartDigraphBase::NodeT,_std::allocator<lemon::SmartDigraphBase::NodeT>_>
                                    ._M_impl.super__Vector_impl_data + 4 +
                         (long)pNVar12[lVar15]._id * 8);
        if (iVar10 != -1) {
          do {
            local_6c._id = (this->_gr->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                           super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar10].target;
            dVar18 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15] -
                     (this->_length->resource_map->
                     super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>_>
                     ).
                     super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Arc,_std::vector<double,_std::allocator<double>_>_>
                     .super_Map.values[iVar10].super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[this->_length->r];
            pdVar3 = (this->_dist->
                     super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>_>
                     ).
                     super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_double>
                     .super_Map.container.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (dVar18 < pdVar3[local_6c._id]) {
              (this->_pred->
              super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>_>
              ).
              super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_lemon::SmartDigraphBase::Arc>
              .super_Map.values[local_6c._id]._id = iVar10;
              uVar13 = (ulong)local_6c._id;
              pdVar3[uVar13] = dVar18;
              iVar14 = local_6c._id + 0x3f;
              if (-1 < (long)uVar13) {
                iVar14 = local_6c._id;
              }
              p_Var2 = (this->_mask->
                       super_MapExtender<lemon::DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>_>
                       ).
                       super_DefaultMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
                       .super_Map.container.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar11 = (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001);
              uVar5 = p_Var2[(long)(iVar14 >> 6) + uVar11 + 0xffffffffffffffff];
              if ((uVar5 >> (uVar13 & 0x3f) & 1) == 0) {
                p_Var2[(long)(iVar14 >> 6) + uVar11 + 0xffffffffffffffff] =
                     uVar5 | 1L << ((byte)local_6c._id & 0x3f);
                if (iStack_60._M_current == local_58) {
                  std::
                  vector<lemon::SmartDigraphBase::Node,std::allocator<lemon::SmartDigraphBase::Node>>
                  ::_M_realloc_insert<lemon::SmartDigraphBase::Node_const&>
                            ((vector<lemon::SmartDigraphBase::Node,std::allocator<lemon::SmartDigraphBase::Node>>
                              *)&local_68,iStack_60,&local_6c);
                }
                else {
                  (iStack_60._M_current)->_id = local_6c._id;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
              }
            }
            iVar10 = (pDVar4->super_ExtendedSmartDigraphBase).super_SmartDigraphBase._arcs.
                     super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar10].next_out;
          } while (iVar10 != -1);
          pNVar12 = (this->_process).
                    super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar8 = (this->_process).
                   super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        lVar15 = lVar15 + 1;
        iVar16._M_current = (Node *)iStack_60;
        pNVar17 = local_68;
      } while (lVar15 < (int)((ulong)((long)pNVar8 - (long)pNVar12) >> 2));
      goto LAB_00159f2b;
    }
  }
  local_58 = (pointer)0x0;
  iVar16._M_current = (pointer)0x0;
  pNVar17 = (pointer)0x0;
LAB_00159f2b:
  pNVar6 = (this->_process).
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = pNVar17;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = iVar16._M_current;
  (this->_process).
  super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
  local_68 = pNVar12;
  iStack_60._M_current = pNVar8;
  local_58 = pNVar6;
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return pNVar17 == iVar16._M_current;
}

Assistant:

bool processNextRound() {
    for (int i = 0; i < int(_process.size()); ++i) {
      _mask->set(_process[i], false);
    }
    std::vector<Node>  nextProcess;
    std::vector<Value> values(_process.size());
    for (int i = 0; i < int(_process.size()); ++i) {
      values[i] = (*_dist)[_process[i]];
    }
    for (int i = 0; i < int(_process.size()); ++i) {
      for (OutArcIt it(*_gr, _process[i]); it != INVALID; ++it) {
        Node  target  = _gr->target(it);
        Value relaxed = OperationTraits::plus(values[i], (*_length)[it]);
        if (OperationTraits::less(relaxed, (*_dist)[target])) {
          _pred->set(target, it);
          _dist->set(target, relaxed);
          if (!(*_mask)[target]) {
            _mask->set(target, true);
            nextProcess.push_back(target);
          }
        }
      }
    }
    _process.swap(nextProcess);
    return _process.empty();
  }